

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall Parser::parseOrExpr(Parser *this)

{
  Parser *in_RSI;
  undefined1 local_44 [12];
  undefined1 local_38 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> right;
  Parser *this_local;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *expr;
  
  parseAndExpr(this);
  while ((in_RSI->m_currToken).type == Or) {
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    parseAndExpr((Parser *)local_38);
    local_44._0_4_ = 6;
    std::
    make_unique<AST::BinaryExpr,TokenType,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((TokenType *)(local_44 + 4),
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_44,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)this);
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::operator=
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,
               (unique_ptr<AST::BinaryExpr,_std::default_delete<AST::BinaryExpr>_> *)(local_44 + 4))
    ;
    std::unique_ptr<AST::BinaryExpr,_std::default_delete<AST::BinaryExpr>_>::~unique_ptr
              ((unique_ptr<AST::BinaryExpr,_std::default_delete<AST::BinaryExpr>_> *)(local_44 + 4))
    ;
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_38);
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseOrExpr() {
    std::unique_ptr<AST::Expr> expr = parseAndExpr();
    while (m_currToken.type == TokenType::Or) {
        eatToken(m_currToken.type);
        auto right = parseAndExpr();
        expr = std::make_unique<AST::BinaryExpr>(TokenType::Or,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}